

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx512::forward_int8_x86
          (ConvolutionDepthWise_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  undefined4 uVar5;
  int iVar6;
  int *piVar7;
  void *pvVar8;
  void *pvVar9;
  Layer *pLVar10;
  float fVar11;
  ulong uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined4 uVar27;
  Mat *pMVar28;
  undefined8 uVar29;
  Option OVar30;
  Option OVar31;
  undefined1 auVar32 [48];
  int iVar33;
  _func_int **pp_Var34;
  undefined1 uVar35;
  uint uVar36;
  _func_int **pp_Var37;
  Allocator *pAVar38;
  _func_int *p_Var39;
  undefined4 *puVar40;
  int iVar41;
  long lVar42;
  int iVar43;
  uint _elempack;
  uint uVar44;
  int iVar45;
  float fVar46;
  iterator iVar47;
  int iVar48;
  Option *_elemsize;
  undefined1 (*pauVar49) [16];
  Option *opt_00;
  int iVar50;
  long lVar51;
  undefined1 (*pauVar52) [16];
  long lVar53;
  long lVar54;
  ulong uVar55;
  ulong uVar56;
  bool bVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [64];
  float fVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar94;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [64];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [64];
  __m128 min;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  __m128 max;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  v4sf one;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  Option opt_q;
  float top_rescale;
  float scale_out;
  Mat m_1;
  Option opt_g;
  float *local_310;
  float *local_300;
  long local_2f0;
  undefined1 local_2e8 [24];
  int iStack_2d0;
  Allocator *pAStack_2c8;
  undefined8 uStack_2c0;
  undefined8 uStack_2b8;
  int iStack_2b0;
  undefined1 auStack_2cc [36];
  size_t local_2a8;
  ulong local_298;
  _func_int **local_290;
  Mat *local_288;
  long local_280;
  undefined1 local_278 [24];
  int iStack_260;
  Allocator *pAStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  int iStack_240;
  undefined1 auStack_25c [36];
  size_t local_238;
  ulong local_230;
  Mat local_228;
  ulong local_1d8;
  float local_1cc;
  pointer local_1c8;
  int *local_1c0;
  Allocator *local_1b8;
  int local_1b0;
  Allocator *local_1a8;
  int local_1a0;
  int iStack_19c;
  int iStack_198;
  int iStack_194;
  undefined4 local_190;
  ulong local_188;
  _func_int **local_180;
  size_type local_178;
  long local_170;
  Mat local_168;
  void *local_120;
  int *local_118;
  Allocator *local_110;
  int local_108;
  Allocator *local_100;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int local_e8;
  ulong local_e0;
  vector<float,_std::allocator<float>_> local_d8;
  vector<float,_std::allocator<float>_> local_c0;
  vector<float,_std::allocator<float>_> local_a8;
  vector<float,_std::allocator<float>_> local_90;
  undefined1 local_78 [16];
  undefined1 auStack_68 [48];
  undefined1 auVar76 [16];
  undefined1 auVar71 [16];
  
  local_168.c = bottom_blob->c;
  local_168.elempack = bottom_blob->elempack;
  local_168.elemsize = bottom_blob->elemsize;
  pp_Var37 = this->_vptr_ConvolutionDepthWise_x86_avx512;
  p_Var39 = pp_Var37[-3];
  iVar43 = *(int *)(&this->field_0xd4 + (long)p_Var39);
  iVar50 = *(int *)(&this->field_0xd8 + (long)p_Var39);
  iVar45 = *(int *)(&this->field_0xdc + (long)p_Var39);
  iVar4 = *(int *)(&this->field_0xe0 + (long)p_Var39);
  piVar7 = bottom_blob->refcount;
  local_168.data = bottom_blob->data;
  local_168.refcount = bottom_blob->refcount;
  local_168.allocator = bottom_blob->allocator;
  local_168.dims = bottom_blob->dims;
  local_168.w = bottom_blob->w;
  local_168.h = bottom_blob->h;
  local_168.d = bottom_blob->d;
  local_168.cstep = bottom_blob->cstep;
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + 1;
    UNLOCK();
    pp_Var37 = this->_vptr_ConvolutionDepthWise_x86_avx512;
  }
  if (local_168.elempack == 0 || ((int)local_168.elemsize * 8) / local_168.elempack != 8) {
    uVar56 = (long)(local_168.elempack * local_168.c) /
             (long)*(int *)(&this->field_0x108 + (long)pp_Var37[-3]);
    local_228.cstep = 0;
    local_228.data = (undefined4 *)0x0;
    local_228.refcount._0_4_ = 0;
    local_228.refcount._4_4_ = 0;
    local_228.elemsize = 0;
    local_228.elempack = 0;
    local_228.allocator = (Allocator *)0x0;
    local_228.dims = 0;
    local_228.w = 0;
    local_228.h = 0;
    local_228.d = 0;
    local_228.c = 0;
    Mat::create(&local_228,local_168.elempack * local_168.c,4,(Allocator *)0x0);
    pp_Var37 = this->_vptr_ConvolutionDepthWise_x86_avx512;
    p_Var39 = pp_Var37[-3];
    if (0 < *(int *)(&this->field_0x108 + (long)p_Var39)) {
      lVar42 = 0;
      puVar40 = (undefined4 *)local_228.data;
      do {
        if (0 < (int)uVar56) {
          uVar5 = *(undefined4 *)(*(long *)(&this->field_0x240 + (long)p_Var39) + lVar42 * 4);
          uVar55 = uVar56 & 0xffffffff;
          do {
            *puVar40 = uVar5;
            puVar40 = puVar40 + 1;
            uVar44 = (int)uVar55 - 1;
            uVar55 = (ulong)uVar44;
          } while (uVar44 != 0);
          p_Var39 = pp_Var37[-3];
        }
        lVar42 = lVar42 + 1;
      } while (lVar42 < *(int *)(&this->field_0x108 + (long)p_Var39));
    }
    auVar90 = vmovdqu64_avx512f((undefined1  [64])*opt);
    auVar90 = vmovdqu64_avx512f(auVar90);
    stack0xfffffffffffffd28 = auVar90._16_48_;
    local_2e8._0_8_ = auVar90._0_8_;
    local_2e8._8_8_ = opt->workspace_allocator;
    quantize_to_int8(bottom_blob,&local_168,&local_228,(Option *)local_2e8);
    piVar7 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if (local_228.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_228.data != (undefined4 *)0x0) {
            free(local_228.data);
          }
        }
        else {
          (*(local_228.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    pp_Var37 = this->_vptr_ConvolutionDepthWise_x86_avx512;
  }
  local_228.cstep = 0;
  local_228.data = (void *)0x0;
  local_228.refcount._0_4_ = 0;
  local_228.refcount._4_4_ = 0;
  local_228.elemsize = 0;
  local_228.elempack = 0;
  local_228.allocator = (Allocator *)0x0;
  local_228.dims = 0;
  local_228.w = 0;
  local_228.h = 0;
  local_228.d = 0;
  local_228.c = 0;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)
             ((long)&this->_vptr_ConvolutionDepthWise_x86_avx512 + (long)pp_Var37[-3]),&local_168,
             &local_228,opt);
  iVar33 = local_228.w;
  iVar6 = local_228.elempack;
  iVar41 = -100;
  if ((local_228.data == (void *)0x0) || (local_228.cstep * (long)local_228.c == 0))
  goto LAB_003ef491;
  p_Var39 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
  iVar43 = (~((iVar43 + -1) * iVar45) + local_228.w) / *(int *)(&this->field_0xe4 + (long)p_Var39);
  iVar45 = iVar43 + 1;
  uVar56 = (long)(~((iVar50 + -1) * iVar4) + local_228.h) /
           (long)*(int *)(&this->field_0xe8 + (long)p_Var39);
  local_230 = uVar56 & 0xffffffff;
  iVar50 = (int)uVar56 + 1;
  uVar44 = local_228.elempack * local_228.c;
  if ((uVar44 == *(uint *)(&this->field_0x108 + (long)p_Var39)) &&
     (uVar44 == *(uint *)(&this->field_0xd0 + (long)p_Var39))) {
    uVar36 = 8;
    if (opt->use_packing_layout == false) {
      uVar36 = 1;
    }
    if ((uVar44 & 7) != 0) {
      uVar36 = 1;
    }
    opt_00 = (Option *)(ulong)uVar36;
    iVar4 = *(int *)(&this->field_0x10c + (long)p_Var39);
    _elemsize = (Option *)(ulong)(uVar36 * 4);
    if (100 < iVar4) {
      _elemsize = opt_00;
    }
    local_280 = (long)local_228.c;
    Mat::create(top_blob,iVar45,iVar50,(int)uVar44 / (int)uVar36,(size_t)_elemsize,uVar36,
                opt->blob_allocator);
    if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
    goto LAB_003ef491;
    iVar41 = 0;
    if (iVar6 != 1) {
      if (iVar6 == 8) {
        uVar56 = (long)*(int *)(&this->field_0xd8 +
                               (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]) *
                 (long)*(int *)(&this->field_0xd4 +
                               (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_2e8,uVar56,(allocator_type *)local_278
                  );
        pp_Var37 = this->_vptr_ConvolutionDepthWise_x86_avx512;
        p_Var39 = pp_Var37[-3];
        if (0 < *(int *)(&this->field_0xd8 + (long)p_Var39)) {
          iVar50 = *(int *)(&this->field_0xe0 + (long)p_Var39);
          iVar45 = *(int *)(&this->field_0xdc + (long)p_Var39);
          iVar6 = *(int *)(&this->field_0xd4 + (long)p_Var39);
          iVar41 = 0;
          fVar46 = 0.0;
          iVar48 = 0;
          do {
            if (0 < *(int *)(&this->field_0xd4 + (long)p_Var39)) {
              lVar42 = 0;
              do {
                *(float *)(local_2e8._0_8_ + (iVar41 + lVar42) * 4) = fVar46;
                p_Var39 = pp_Var37[-3];
                fVar46 = (float)((int)fVar46 + *(int *)(&this->field_0xdc + (long)p_Var39));
                lVar42 = lVar42 + 1;
              } while ((int)lVar42 < *(int *)(&this->field_0xd4 + (long)p_Var39));
              iVar41 = iVar41 + (int)lVar42;
            }
            fVar46 = (float)((int)fVar46 + (iVar33 * iVar50 - iVar45 * iVar6));
            iVar48 = iVar48 + 1;
          } while (iVar48 < *(int *)(&this->field_0xd8 + (long)p_Var39));
        }
        if (0 < (int)local_280) {
          local_298 = 0;
          auVar92._8_4_ = 0x80000000;
          auVar92._0_8_ = 0x8000000080000000;
          auVar92._12_4_ = 0x80000000;
          auVar93._8_4_ = 0x3f000000;
          auVar93._0_8_ = 0x3f0000003f000000;
          auVar93._12_4_ = 0x3f000000;
          auVar58 = vpbroadcastw_avx512vl(ZEXT216(0x7f));
          auVar90 = ZEXT1664(auVar58);
          auVar58 = vpbroadcastw_avx512vl(ZEXT216(0xff81));
          auVar59 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
          auVar60 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
          auVar119._8_4_ = 0x3fb8aa3b;
          auVar119._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar119._12_4_ = 0x3fb8aa3b;
          auVar120._8_4_ = 0x3f000000;
          auVar120._0_8_ = 0x3f0000003f000000;
          auVar120._12_4_ = 0x3f000000;
          auVar121._8_4_ = 0x3f800000;
          auVar121._0_8_ = 0x3f8000003f800000;
          auVar121._12_4_ = 0x3f800000;
          auVar122._8_4_ = 0x3f318000;
          auVar122._0_8_ = 0x3f3180003f318000;
          auVar122._12_4_ = 0x3f318000;
          auVar123._8_4_ = 0xb95e8083;
          auVar123._0_8_ = 0xb95e8083b95e8083;
          auVar123._12_4_ = 0xb95e8083;
          auVar61 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
          auVar130._8_4_ = 0x39506967;
          auVar130._0_8_ = 0x3950696739506967;
          auVar130._12_4_ = 0x39506967;
          auVar131._8_4_ = 0x3c088908;
          auVar131._0_8_ = 0x3c0889083c088908;
          auVar131._12_4_ = 0x3c088908;
          auVar132._8_4_ = 0x3d2aa9c1;
          auVar132._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar132._12_4_ = 0x3d2aa9c1;
          auVar62 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
          auVar63 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
          local_2f0 = 0;
          auVar64 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
          auVar65 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
          auVar66 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
          auVar67 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
          auVar68 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
          do {
            if (-1 < (int)local_230) {
              pauVar49 = (undefined1 (*) [16])
                         (top_blob->elemsize * local_2f0 * top_blob->cstep + (long)top_blob->data);
              pp_Var37 = this->_vptr_ConvolutionDepthWise_x86_avx512;
              pvVar8 = (this->weight_data_tm).data;
              pp_Var34 = (_func_int **)0x0;
              pauVar52 = pauVar49;
              do {
                local_290 = pp_Var34;
                iVar50 = (int)local_290;
                if (-1 < iVar43) {
                  iVar45 = 0;
                  do {
                    p_Var39 = pp_Var37[-3];
                    if ((int)uVar56 < 1) {
                      auVar89 = ZEXT816(0) << 0x40;
                      auVar88 = ZEXT816(0) << 0x40;
                    }
                    else {
                      auVar99 = ZEXT1664((undefined1  [16])0x0);
                      uVar55 = 0;
                      auVar104 = ZEXT1664((undefined1  [16])0x0);
                      do {
                        auVar89._8_8_ = 0;
                        auVar89._0_8_ =
                             *(ulong *)((long)local_228.data +
                                       (long)(int)*(pointer)(local_2e8._0_8_ + uVar55 * 4) * 8 +
                                       (long)*(int *)(&this->field_0xe8 + (long)p_Var39) *
                                       (long)iVar50 * (long)local_228.w * local_228.elemsize +
                                       (long)(*(int *)(&this->field_0xe4 + (long)p_Var39) * iVar45 *
                                             8) + local_228.cstep * local_2f0 * local_228.elemsize);
                        auVar88 = vpcmpgtb_avx((undefined1  [16])0x0,auVar89);
                        auVar89 = vpunpcklbw_avx(auVar89,auVar88);
                        auVar71._8_8_ = 0;
                        auVar71._0_8_ = *(ulong *)((long)pvVar8 + uVar55 * 8 + (long)(int)local_298)
                        ;
                        auVar88 = vpcmpgtb_avx((undefined1  [16])0x0,auVar71);
                        auVar88 = vpunpcklbw_avx(auVar71,auVar88);
                        auVar71 = vpmullw_avx(auVar88,auVar89);
                        auVar89 = vpmulhw_avx(auVar89,auVar88);
                        auVar88 = vpunpcklwd_avx(auVar71,auVar89);
                        auVar88 = vpaddd_avx(auVar99._0_16_,auVar88);
                        auVar99 = ZEXT1664(auVar88);
                        auVar89 = vpunpckhwd_avx(auVar71,auVar89);
                        auVar89 = vpaddd_avx(auVar104._0_16_,auVar89);
                        auVar104 = ZEXT1664(auVar89);
                        uVar55 = uVar55 + 1;
                      } while ((uVar56 & 0xffffffff) != uVar55);
                      auVar88 = vcvtdq2ps_avx(auVar88);
                      auVar89 = vcvtdq2ps_avx(auVar89);
                    }
                    auVar71 = *(undefined1 (*) [16])
                               (*(long *)(&this->field_0x1f8 + (long)p_Var39) + local_2f0 * 0x20);
                    auVar85 = *(undefined1 (*) [16])
                               (*(long *)(&this->field_0x1f8 + (long)p_Var39) + 0x10 +
                               local_2f0 * 0x20);
                    pfVar1 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var39) +
                                      local_2f0 * 0x20);
                    auVar70._0_4_ = auVar71._0_4_ * *pfVar1;
                    auVar70._4_4_ = auVar71._4_4_ * pfVar1[1];
                    auVar70._8_4_ = auVar71._8_4_ * pfVar1[2];
                    auVar70._12_4_ = auVar71._12_4_ * pfVar1[3];
                    auVar70 = vrcpps_avx(auVar70);
                    auVar69 = vmulps_avx512vl(auVar85,*(undefined1 (*) [16])
                                                       (*(long *)(&this->field_0x240 + (long)p_Var39
                                                                 ) + 0x10 + local_2f0 * 0x20));
                    auVar69 = vrcpps_avx(auVar69);
                    uVar55 = vcmpps_avx512vl(auVar71,(undefined1  [16])0x0,4);
                    uVar12 = vcmpps_avx512vl(auVar85,(undefined1  [16])0x0,4);
                    auVar85._0_4_ =
                         (float)((uint)((byte)uVar55 & 1) * auVar70._0_4_) * auVar88._0_4_;
                    auVar85._4_4_ =
                         (float)((uint)((byte)(uVar55 >> 1) & 1) * auVar70._4_4_) * auVar88._4_4_;
                    auVar85._8_4_ =
                         (float)((uint)((byte)(uVar55 >> 2) & 1) * auVar70._8_4_) * auVar88._8_4_;
                    auVar85._12_4_ =
                         (float)((uint)((byte)(uVar55 >> 3) & 1) * auVar70._12_4_) * auVar88._12_4_;
                    auVar88._0_4_ =
                         (float)((uint)((byte)uVar12 & 1) * auVar69._0_4_) * auVar89._0_4_;
                    auVar88._4_4_ =
                         (float)((uint)((byte)(uVar12 >> 1) & 1) * auVar69._4_4_) * auVar89._4_4_;
                    auVar88._8_4_ =
                         (float)((uint)((byte)(uVar12 >> 2) & 1) * auVar69._8_4_) * auVar89._8_4_;
                    auVar88._12_4_ =
                         (float)((uint)((byte)(uVar12 >> 3) & 1) * auVar69._12_4_) * auVar89._12_4_;
                    if (*(int *)(&this->field_0x100 + (long)p_Var39) != 0) {
                      pfVar1 = (float *)(*(long *)(&this->field_0x1b0 + (long)p_Var39) +
                                        local_2f0 * 0x20);
                      auVar85._0_4_ = auVar85._0_4_ + *pfVar1;
                      auVar85._4_4_ = auVar85._4_4_ + pfVar1[1];
                      auVar85._8_4_ = auVar85._8_4_ + pfVar1[2];
                      auVar85._12_4_ = auVar85._12_4_ + pfVar1[3];
                      pfVar1 = (float *)(*(long *)(&this->field_0x1b0 + (long)p_Var39) + 0x10 +
                                        local_2f0 * 0x20);
                      auVar88._0_4_ = auVar88._0_4_ + *pfVar1;
                      auVar88._4_4_ = auVar88._4_4_ + pfVar1[1];
                      auVar88._8_4_ = auVar88._8_4_ + pfVar1[2];
                      auVar88._12_4_ = auVar88._12_4_ + pfVar1[3];
                    }
                    fVar46 = auVar85._4_4_;
                    fVar2 = auVar85._8_4_;
                    fVar91 = auVar88._4_4_;
                    fVar3 = auVar88._8_4_;
                    fVar94 = auVar85._12_4_;
                    fVar11 = auVar88._12_4_;
                    switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var39)) {
                    case 1:
                      auVar85 = vmaxps_avx(auVar85,(undefined1  [16])0x0);
                      auVar88 = vmaxps_avx(auVar88,(undefined1  [16])0x0);
                      break;
                    case 2:
                      auVar89 = vmaxps_avx(auVar85,(undefined1  [16])0x0);
                      auVar71 = vminps_avx(auVar85,(undefined1  [16])0x0);
                      uVar5 = **(undefined4 **)(&this->field_0x118 + (long)p_Var39);
                      auVar118._4_4_ = uVar5;
                      auVar118._0_4_ = uVar5;
                      auVar118._8_4_ = uVar5;
                      auVar118._12_4_ = uVar5;
                      auVar85 = vfmadd213ps_fma(auVar71,auVar118,auVar89);
                      auVar89 = vmaxps_avx(auVar88,(undefined1  [16])0x0);
                      auVar88 = vminps_avx(auVar88,(undefined1  [16])0x0);
                      auVar88 = vfmadd213ps_fma(auVar88,auVar118,auVar89);
                      break;
                    case 3:
                      uVar5 = **(undefined4 **)(&this->field_0x118 + (long)p_Var39);
                      auVar107._4_4_ = uVar5;
                      auVar107._0_4_ = uVar5;
                      auVar107._8_4_ = uVar5;
                      auVar107._12_4_ = uVar5;
                      uVar5 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var39))[1];
                      auVar115._4_4_ = uVar5;
                      auVar115._0_4_ = uVar5;
                      auVar115._8_4_ = uVar5;
                      auVar115._12_4_ = uVar5;
                      auVar89 = vmaxps_avx(auVar85,auVar107);
                      auVar85 = vminps_avx(auVar89,auVar115);
                      auVar88 = vmaxps_avx(auVar88,auVar107);
                      auVar88 = vminps_avx(auVar88,auVar115);
                      break;
                    case 4:
                      auVar95._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
                      auVar95._8_4_ = -fVar2;
                      auVar95._12_4_ = -fVar94;
                      auVar89 = vminps_avx512vl(auVar95,auVar59);
                      auVar85 = vmaxps_avx512vl(auVar89,auVar60);
                      auVar71 = vfmadd213ps_fma(auVar119,auVar85,auVar120);
                      auVar116._0_4_ = (int)auVar71._0_4_;
                      auVar116._4_4_ = (int)auVar71._4_4_;
                      auVar116._8_4_ = (int)auVar71._8_4_;
                      auVar116._12_4_ = (int)auVar71._12_4_;
                      auVar89 = vcvtdq2ps_avx(auVar116);
                      uVar55 = vcmpps_avx512vl(auVar71,auVar89,1);
                      auVar71 = vsubps_avx512vl(auVar89,auVar121);
                      bVar57 = (bool)((byte)uVar55 & 1);
                      auVar86._0_4_ =
                           (float)((uint)bVar57 * auVar71._0_4_ | (uint)!bVar57 * auVar89._0_4_);
                      bVar57 = (bool)((byte)(uVar55 >> 1) & 1);
                      auVar86._4_4_ =
                           (float)((uint)bVar57 * auVar71._4_4_ | (uint)!bVar57 * auVar89._4_4_);
                      bVar57 = (bool)((byte)(uVar55 >> 2) & 1);
                      auVar86._8_4_ =
                           (float)((uint)bVar57 * auVar71._8_4_ | (uint)!bVar57 * auVar89._8_4_);
                      bVar57 = (bool)((byte)(uVar55 >> 3) & 1);
                      auVar86._12_4_ =
                           (float)((uint)bVar57 * auVar71._12_4_ | (uint)!bVar57 * auVar89._12_4_);
                      auVar89 = vfmsub231ps_fma(auVar85,auVar86,auVar122);
                      auVar71 = vfnmsub231ps_fma(auVar89,auVar86,auVar123);
                      auVar108._0_4_ = auVar71._0_4_ * auVar71._0_4_;
                      auVar108._4_4_ = auVar71._4_4_ * auVar71._4_4_;
                      auVar108._8_4_ = auVar71._8_4_ * auVar71._8_4_;
                      auVar108._12_4_ = auVar71._12_4_ * auVar71._12_4_;
                      auVar89 = vfmadd213ps_avx512vl(auVar130,auVar71,auVar61);
                      auVar89 = vfmadd213ps_fma(auVar89,auVar71,auVar131);
                      auVar89 = vfmadd213ps_fma(auVar89,auVar71,auVar132);
                      auVar89 = vfmadd213ps_avx512vl(auVar89,auVar71,auVar62);
                      auVar89 = vfmadd213ps_fma(auVar89,auVar71,auVar120);
                      auVar89 = vfmadd213ps_fma(auVar89,auVar108,auVar71);
                      auVar109._0_4_ = auVar89._0_4_ + 1.0;
                      auVar109._4_4_ = auVar89._4_4_ + 1.0;
                      auVar109._8_4_ = auVar89._8_4_ + 1.0;
                      auVar109._12_4_ = auVar89._12_4_ + 1.0;
                      auVar96._0_4_ = (int)auVar86._0_4_;
                      auVar96._4_4_ = (int)auVar86._4_4_;
                      auVar96._8_4_ = (int)auVar86._8_4_;
                      auVar96._12_4_ = (int)auVar86._12_4_;
                      auVar89 = vpslld_avx(auVar96,0x17);
                      auVar89 = vpaddd_avx512vl(auVar89,auVar63);
                      auVar71 = vfmadd213ps_fma(auVar89,auVar109,auVar121);
                      auVar89 = vrcpps_avx(auVar71);
                      auVar71 = vfmsub213ps_fma(auVar71,auVar89,auVar121);
                      auVar85 = vfnmadd132ps_fma(auVar71,auVar89,auVar89);
                      auVar100._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
                      auVar100._8_4_ = -fVar3;
                      auVar100._12_4_ = -fVar11;
                      auVar88 = vminps_avx512vl(auVar100,auVar59);
                      auVar71 = vmaxps_avx512vl(auVar88,auVar60);
                      auVar89 = vfmadd213ps_fma(auVar119,auVar71,auVar120);
                      auVar117._0_4_ = (int)auVar89._0_4_;
                      auVar117._4_4_ = (int)auVar89._4_4_;
                      auVar117._8_4_ = (int)auVar89._8_4_;
                      auVar117._12_4_ = (int)auVar89._12_4_;
                      auVar88 = vcvtdq2ps_avx(auVar117);
                      uVar55 = vcmpps_avx512vl(auVar89,auVar88,1);
                      auVar89 = vsubps_avx512vl(auVar88,auVar121);
                      bVar57 = (bool)((byte)uVar55 & 1);
                      auVar87._0_4_ =
                           (float)((uint)bVar57 * auVar89._0_4_ | (uint)!bVar57 * auVar88._0_4_);
                      bVar57 = (bool)((byte)(uVar55 >> 1) & 1);
                      auVar87._4_4_ =
                           (float)((uint)bVar57 * auVar89._4_4_ | (uint)!bVar57 * auVar88._4_4_);
                      bVar57 = (bool)((byte)(uVar55 >> 2) & 1);
                      auVar87._8_4_ =
                           (float)((uint)bVar57 * auVar89._8_4_ | (uint)!bVar57 * auVar88._8_4_);
                      bVar57 = (bool)((byte)(uVar55 >> 3) & 1);
                      auVar87._12_4_ =
                           (float)((uint)bVar57 * auVar89._12_4_ | (uint)!bVar57 * auVar88._12_4_);
                      auVar88 = vfmsub231ps_fma(auVar71,auVar87,auVar122);
                      auVar89 = vfnmsub231ps_fma(auVar88,auVar87,auVar123);
                      auVar110._0_4_ = auVar89._0_4_ * auVar89._0_4_;
                      auVar110._4_4_ = auVar89._4_4_ * auVar89._4_4_;
                      auVar110._8_4_ = auVar89._8_4_ * auVar89._8_4_;
                      auVar110._12_4_ = auVar89._12_4_ * auVar89._12_4_;
                      auVar88 = vfmadd213ps_avx512vl(auVar130,auVar89,auVar61);
                      auVar88 = vfmadd213ps_fma(auVar88,auVar89,auVar131);
                      auVar88 = vfmadd213ps_fma(auVar88,auVar89,auVar132);
                      auVar88 = vfmadd213ps_avx512vl(auVar88,auVar89,auVar62);
                      auVar88 = vfmadd213ps_fma(auVar88,auVar89,auVar120);
                      auVar88 = vfmadd213ps_fma(auVar88,auVar110,auVar89);
                      auVar111._0_4_ = auVar88._0_4_ + 1.0;
                      auVar111._4_4_ = auVar88._4_4_ + 1.0;
                      auVar111._8_4_ = auVar88._8_4_ + 1.0;
                      auVar111._12_4_ = auVar88._12_4_ + 1.0;
                      auVar101._0_4_ = (int)auVar87._0_4_;
                      auVar101._4_4_ = (int)auVar87._4_4_;
                      auVar101._8_4_ = (int)auVar87._8_4_;
                      auVar101._12_4_ = (int)auVar87._12_4_;
                      auVar88 = vpslld_avx(auVar101,0x17);
                      auVar88 = vpaddd_avx512vl(auVar88,auVar63);
                      auVar89 = vfmadd213ps_fma(auVar88,auVar111,auVar121);
                      auVar88 = vrcpps_avx(auVar89);
                      auVar89 = vfmsub213ps_fma(auVar89,auVar88,auVar121);
                      auVar88 = vfnmadd132ps_fma(auVar89,auVar88,auVar88);
                      break;
                    case 5:
                      auVar89 = vminps_avx512vl(auVar85,auVar59);
                      auVar70 = vmaxps_avx512vl(auVar89,auVar60);
                      auVar71 = vfmadd213ps_fma(auVar119,auVar70,auVar120);
                      auVar124._0_4_ = (int)auVar71._0_4_;
                      auVar124._4_4_ = (int)auVar71._4_4_;
                      auVar124._8_4_ = (int)auVar71._8_4_;
                      auVar124._12_4_ = (int)auVar71._12_4_;
                      auVar89 = vcvtdq2ps_avx(auVar124);
                      uVar55 = vcmpps_avx512vl(auVar71,auVar89,1);
                      auVar71 = vsubps_avx512vl(auVar89,auVar121);
                      bVar57 = (bool)((byte)uVar55 & 1);
                      auVar72._0_4_ =
                           (float)((uint)bVar57 * auVar71._0_4_ | (uint)!bVar57 * auVar89._0_4_);
                      bVar57 = (bool)((byte)(uVar55 >> 1) & 1);
                      auVar72._4_4_ =
                           (float)((uint)bVar57 * auVar71._4_4_ | (uint)!bVar57 * auVar89._4_4_);
                      bVar57 = (bool)((byte)(uVar55 >> 2) & 1);
                      auVar72._8_4_ =
                           (float)((uint)bVar57 * auVar71._8_4_ | (uint)!bVar57 * auVar89._8_4_);
                      bVar57 = (bool)((byte)(uVar55 >> 3) & 1);
                      auVar72._12_4_ =
                           (float)((uint)bVar57 * auVar71._12_4_ | (uint)!bVar57 * auVar89._12_4_);
                      auVar89 = vfmsub231ps_fma(auVar70,auVar72,auVar122);
                      auVar89 = vfnmsub231ps_fma(auVar89,auVar72,auVar123);
                      auVar112._0_4_ = auVar89._0_4_ * auVar89._0_4_;
                      auVar112._4_4_ = auVar89._4_4_ * auVar89._4_4_;
                      auVar112._8_4_ = auVar89._8_4_ * auVar89._8_4_;
                      auVar112._12_4_ = auVar89._12_4_ * auVar89._12_4_;
                      auVar71 = vfmadd213ps_avx512vl(auVar130,auVar89,auVar61);
                      auVar71 = vfmadd213ps_avx512vl(auVar71,auVar89,auVar131);
                      auVar71 = vfmadd213ps_avx512vl(auVar71,auVar89,auVar132);
                      auVar71 = vfmadd213ps_avx512vl(auVar71,auVar89,auVar62);
                      auVar71 = vfmadd213ps_avx512vl(auVar71,auVar89,auVar120);
                      auVar89 = vfmadd213ps_avx512vl(auVar71,auVar112,auVar89);
                      auVar89 = vaddps_avx512vl(auVar89,auVar121);
                      auVar113._0_4_ = (int)auVar72._0_4_;
                      auVar113._4_4_ = (int)auVar72._4_4_;
                      auVar113._8_4_ = (int)auVar72._8_4_;
                      auVar113._12_4_ = (int)auVar72._12_4_;
                      auVar71 = vpslld_avx(auVar113,0x17);
                      auVar71 = vpaddd_avx512vl(auVar71,auVar63);
                      auVar89 = vfmadd213ps_fma(auVar71,auVar89,auVar121);
                      uVar55 = vcmpps_avx512vl(auVar89,(undefined1  [16])0x0,2);
                      auVar69 = vbroadcastss_avx512vl(ZEXT416(0x800000));
                      auVar89 = vmaxps_avx512vl(auVar89,auVar69);
                      auVar70 = vpsrld_avx(auVar89,0x17);
                      auVar71 = vpternlogd_avx512vl(auVar89,auVar93,auVar64,0xec);
                      auVar89 = vpbroadcastd_avx512vl(ZEXT416(0xffffff82));
                      auVar89 = vpaddd_avx512vl(auVar70,auVar89);
                      auVar89 = vcvtdq2ps_avx(auVar89);
                      uVar12 = vcmpps_avx512vl(auVar71,auVar65,1);
                      auVar73 = vmovdqa64_avx512vl(auVar90._0_16_);
                      auVar74 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
                      auVar70 = vaddps_avx512vl(auVar71,auVar74);
                      auVar75 = vsubps_avx512vl(auVar89,auVar121);
                      bVar57 = (bool)((byte)uVar12 & 1);
                      auVar76._0_4_ = (uint)bVar57 * auVar75._0_4_ | (uint)!bVar57 * auVar89._0_4_;
                      bVar57 = (bool)((byte)(uVar12 >> 1) & 1);
                      auVar76._4_4_ = (uint)bVar57 * auVar75._4_4_ | (uint)!bVar57 * auVar89._4_4_;
                      bVar57 = (bool)((byte)(uVar12 >> 2) & 1);
                      auVar76._8_4_ = (uint)bVar57 * auVar75._8_4_ | (uint)!bVar57 * auVar89._8_4_;
                      bVar57 = (bool)((byte)(uVar12 >> 3) & 1);
                      auVar76._12_4_ =
                           (uint)bVar57 * auVar75._12_4_ | (uint)!bVar57 * auVar89._12_4_;
                      auVar89 = vaddps_avx512vl(auVar70,auVar71);
                      bVar57 = (bool)((byte)uVar12 & 1);
                      auVar77._0_4_ =
                           (float)((uint)bVar57 * auVar89._0_4_ | (uint)!bVar57 * auVar70._0_4_);
                      bVar57 = (bool)((byte)(uVar12 >> 1) & 1);
                      auVar77._4_4_ =
                           (float)((uint)bVar57 * auVar89._4_4_ | (uint)!bVar57 * auVar70._4_4_);
                      bVar57 = (bool)((byte)(uVar12 >> 2) & 1);
                      auVar77._8_4_ =
                           (float)((uint)bVar57 * auVar89._8_4_ | (uint)!bVar57 * auVar70._8_4_);
                      bVar57 = (bool)((byte)(uVar12 >> 3) & 1);
                      auVar77._12_4_ =
                           (float)((uint)bVar57 * auVar89._12_4_ | (uint)!bVar57 * auVar70._12_4_);
                      auVar105._0_4_ = auVar77._0_4_ * auVar77._0_4_;
                      auVar105._4_4_ = auVar77._4_4_ * auVar77._4_4_;
                      auVar105._8_4_ = auVar77._8_4_ * auVar77._8_4_;
                      auVar105._12_4_ = auVar77._12_4_ * auVar77._12_4_;
                      auVar89 = vfmadd213ps_avx512vl(auVar66,auVar77,auVar67);
                      auVar89 = vfmadd213ps_avx512vl(auVar89,auVar77,auVar68);
                      auVar71 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
                      auVar89 = vfmadd213ps_avx512vl(auVar89,auVar77,auVar71);
                      auVar71 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
                      auVar89 = vfmadd213ps_avx512vl(auVar89,auVar77,auVar71);
                      auVar71 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
                      auVar89 = vfmadd213ps_avx512vl(auVar89,auVar77,auVar71);
                      auVar71 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
                      auVar89 = vfmadd213ps_avx512vl(auVar89,auVar77,auVar71);
                      auVar71 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
                      auVar89 = vfmadd213ps_avx512vl(auVar89,auVar77,auVar71);
                      auVar71 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
                      auVar89 = vfmadd213ps_avx512vl(auVar89,auVar77,auVar71);
                      auVar71 = vmulps_avx512vl(auVar105,auVar77);
                      auVar89 = vmulps_avx512vl(auVar71,auVar89);
                      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar76,auVar123);
                      auVar89 = vfmsub231ps_avx512vl(auVar89,auVar120,auVar105);
                      auVar89 = vsubps_avx512vl(auVar89,auVar77);
                      auVar89 = vfmsub231ps_fma(auVar89,auVar122,auVar76);
                      bVar57 = (bool)((byte)uVar55 & 1);
                      auVar78._0_4_ =
                           (uint)bVar57 * 0x7fffffff | (uint)!bVar57 * (int)(auVar89._0_4_ * -2.0);
                      bVar57 = (bool)((byte)(uVar55 >> 1) & 1);
                      auVar78._4_4_ =
                           (uint)bVar57 * 0x7fffffff | (uint)!bVar57 * (int)(auVar89._4_4_ * -2.0);
                      bVar57 = (bool)((byte)(uVar55 >> 2) & 1);
                      auVar78._8_4_ =
                           (uint)bVar57 * 0x7fffffff | (uint)!bVar57 * (int)(auVar89._8_4_ * -2.0);
                      bVar57 = (bool)((byte)(uVar55 >> 3) & 1);
                      auVar78._12_4_ =
                           (uint)bVar57 * 0x7fffffff | (uint)!bVar57 * (int)(auVar89._12_4_ * -2.0);
                      auVar89 = vminps_avx512vl(auVar78,auVar59);
                      auVar70 = vmaxps_avx512vl(auVar89,auVar60);
                      auVar71 = vfmadd213ps_fma(auVar119,auVar70,auVar120);
                      auVar125._0_4_ = (int)auVar71._0_4_;
                      auVar125._4_4_ = (int)auVar71._4_4_;
                      auVar125._8_4_ = (int)auVar71._8_4_;
                      auVar125._12_4_ = (int)auVar71._12_4_;
                      auVar89 = vcvtdq2ps_avx(auVar125);
                      uVar55 = vcmpps_avx512vl(auVar71,auVar89,1);
                      auVar71 = vsubps_avx512vl(auVar89,auVar121);
                      bVar57 = (bool)((byte)uVar55 & 1);
                      auVar79._0_4_ =
                           (float)((uint)bVar57 * auVar71._0_4_ | (uint)!bVar57 * auVar89._0_4_);
                      bVar57 = (bool)((byte)(uVar55 >> 1) & 1);
                      auVar79._4_4_ =
                           (float)((uint)bVar57 * auVar71._4_4_ | (uint)!bVar57 * auVar89._4_4_);
                      bVar57 = (bool)((byte)(uVar55 >> 2) & 1);
                      auVar79._8_4_ =
                           (float)((uint)bVar57 * auVar71._8_4_ | (uint)!bVar57 * auVar89._8_4_);
                      bVar57 = (bool)((byte)(uVar55 >> 3) & 1);
                      auVar79._12_4_ =
                           (float)((uint)bVar57 * auVar71._12_4_ | (uint)!bVar57 * auVar89._12_4_);
                      auVar89 = vfmsub231ps_fma(auVar70,auVar79,auVar122);
                      auVar89 = vfnmsub231ps_fma(auVar89,auVar79,auVar123);
                      auVar114._0_4_ = auVar89._0_4_ * auVar89._0_4_;
                      auVar114._4_4_ = auVar89._4_4_ * auVar89._4_4_;
                      auVar114._8_4_ = auVar89._8_4_ * auVar89._8_4_;
                      auVar114._12_4_ = auVar89._12_4_ * auVar89._12_4_;
                      auVar71 = vfmadd213ps_avx512vl(auVar130,auVar89,auVar61);
                      auVar71 = vfmadd213ps_avx512vl(auVar71,auVar89,auVar131);
                      auVar71 = vfmadd213ps_avx512vl(auVar71,auVar89,auVar132);
                      auVar71 = vfmadd213ps_avx512vl(auVar71,auVar89,auVar62);
                      auVar71 = vfmadd213ps_avx512vl(auVar71,auVar89,auVar120);
                      auVar89 = vfmadd213ps_avx512vl(auVar71,auVar114,auVar89);
                      auVar89 = vaddps_avx512vl(auVar89,auVar121);
                      auVar106._0_4_ = (int)auVar79._0_4_;
                      auVar106._4_4_ = (int)auVar79._4_4_;
                      auVar106._8_4_ = (int)auVar79._8_4_;
                      auVar106._12_4_ = (int)auVar79._12_4_;
                      auVar71 = vpslld_avx(auVar106,0x17);
                      auVar71 = vpaddd_avx512vl(auVar71,auVar63);
                      auVar71 = vfmadd213ps_fma(auVar71,auVar89,auVar121);
                      auVar89 = vrcpps_avx(auVar71);
                      auVar126._0_4_ = auVar89._0_4_ + auVar89._0_4_;
                      auVar126._4_4_ = auVar89._4_4_ + auVar89._4_4_;
                      auVar126._8_4_ = auVar89._8_4_ + auVar89._8_4_;
                      auVar126._12_4_ = auVar89._12_4_ + auVar89._12_4_;
                      auVar70 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
                      auVar71 = vfmsub213ps_avx512vl(auVar71,auVar126,auVar70);
                      auVar70 = vfnmadd213ps_fma(auVar71,auVar89,auVar126);
                      auVar89 = vminps_avx512vl(auVar88,auVar59);
                      auVar71 = vmaxps_avx512vl(auVar89,auVar60);
                      auVar89 = vfmadd213ps_fma(auVar119,auVar71,auVar120);
                      auVar75 = vcvttps2dq_avx512vl(auVar89);
                      auVar75 = vcvtdq2ps_avx512vl(auVar75);
                      uVar55 = vcmpps_avx512vl(auVar89,auVar75,1);
                      auVar89 = vsubps_avx512vl(auVar75,auVar121);
                      bVar57 = (bool)((byte)uVar55 & 1);
                      auVar80._0_4_ = (uint)bVar57 * auVar89._0_4_ | (uint)!bVar57 * auVar75._0_4_;
                      bVar57 = (bool)((byte)(uVar55 >> 1) & 1);
                      auVar80._4_4_ = (uint)bVar57 * auVar89._4_4_ | (uint)!bVar57 * auVar75._4_4_;
                      bVar57 = (bool)((byte)(uVar55 >> 2) & 1);
                      auVar80._8_4_ = (uint)bVar57 * auVar89._8_4_ | (uint)!bVar57 * auVar75._8_4_;
                      bVar57 = (bool)((byte)(uVar55 >> 3) & 1);
                      auVar80._12_4_ =
                           (uint)bVar57 * auVar89._12_4_ | (uint)!bVar57 * auVar75._12_4_;
                      auVar89 = vfmsub231ps_avx512vl(auVar71,auVar80,auVar122);
                      auVar89 = vfnmsub231ps_avx512vl(auVar89,auVar80,auVar123);
                      auVar127._0_4_ = auVar89._0_4_ * auVar89._0_4_;
                      auVar127._4_4_ = auVar89._4_4_ * auVar89._4_4_;
                      auVar127._8_4_ = auVar89._8_4_ * auVar89._8_4_;
                      auVar127._12_4_ = auVar89._12_4_ * auVar89._12_4_;
                      auVar71 = vfmadd213ps_avx512vl(auVar130,auVar89,auVar61);
                      auVar71 = vfmadd213ps_avx512vl(auVar71,auVar89,auVar131);
                      auVar71 = vfmadd213ps_avx512vl(auVar71,auVar89,auVar132);
                      auVar71 = vfmadd213ps_avx512vl(auVar71,auVar89,auVar62);
                      auVar71 = vfmadd213ps_avx512vl(auVar71,auVar89,auVar120);
                      auVar89 = vfmadd213ps_avx512vl(auVar71,auVar127,auVar89);
                      auVar89 = vaddps_avx512vl(auVar89,auVar121);
                      auVar71 = vcvttps2dq_avx512vl(auVar80);
                      auVar71 = vpslld_avx(auVar71,0x17);
                      auVar71 = vpaddd_avx512vl(auVar71,auVar63);
                      auVar89 = vfmadd213ps_fma(auVar71,auVar89,auVar121);
                      uVar55 = vcmpps_avx512vl(auVar89,(undefined1  [16])0x0,2);
                      auVar89 = vmaxps_avx512vl(auVar89,auVar69);
                      auVar128 = vpsrld_avx(auVar89,0x17);
                      auVar89 = vpternlogd_avx512vl(auVar89,auVar93,auVar64,0xec);
                      uVar12 = vcmpps_avx512vl(auVar89,auVar65,1);
                      auVar71 = vaddps_avx512vl(auVar89,auVar74);
                      auVar69 = vmovdqa64_avx512vl(auVar73);
                      auVar90 = ZEXT1664(auVar69);
                      auVar89 = vaddps_avx512vl(auVar71,auVar89);
                      bVar57 = (bool)((byte)uVar12 & 1);
                      auVar81._0_4_ = (uint)bVar57 * auVar89._0_4_ | (uint)!bVar57 * auVar71._0_4_;
                      bVar57 = (bool)((byte)(uVar12 >> 1) & 1);
                      auVar81._4_4_ = (uint)bVar57 * auVar89._4_4_ | (uint)!bVar57 * auVar71._4_4_;
                      bVar57 = (bool)((byte)(uVar12 >> 2) & 1);
                      auVar81._8_4_ = (uint)bVar57 * auVar89._8_4_ | (uint)!bVar57 * auVar71._8_4_;
                      bVar57 = (bool)((byte)(uVar12 >> 3) & 1);
                      auVar81._12_4_ =
                           (uint)bVar57 * auVar89._12_4_ | (uint)!bVar57 * auVar71._12_4_;
                      auVar71 = vmulps_avx512vl(auVar81,auVar81);
                      auVar89 = vfmadd213ps_avx512vl(auVar66,auVar81,auVar67);
                      auVar89 = vfmadd213ps_avx512vl(auVar89,auVar81,auVar68);
                      auVar74._8_4_ = 0xbdfe5d4f;
                      auVar74._0_8_ = 0xbdfe5d4fbdfe5d4f;
                      auVar74._12_4_ = 0xbdfe5d4f;
                      auVar89 = vfmadd213ps_avx512vl(auVar89,auVar81,auVar74);
                      auVar75._8_4_ = 0x3e11e9bf;
                      auVar75._0_8_ = 0x3e11e9bf3e11e9bf;
                      auVar75._12_4_ = 0x3e11e9bf;
                      auVar89 = vfmadd213ps_avx512vl(auVar89,auVar81,auVar75);
                      auVar14._8_4_ = 0xbe2aae50;
                      auVar14._0_8_ = 0xbe2aae50be2aae50;
                      auVar14._12_4_ = 0xbe2aae50;
                      auVar89 = vfmadd213ps_avx512vl(auVar89,auVar81,auVar14);
                      auVar15._8_4_ = 0x3e4cceac;
                      auVar15._0_8_ = 0x3e4cceac3e4cceac;
                      auVar15._12_4_ = 0x3e4cceac;
                      auVar89 = vfmadd213ps_avx512vl(auVar89,auVar81,auVar15);
                      auVar16._8_4_ = 0xbe7ffffc;
                      auVar16._0_8_ = 0xbe7ffffcbe7ffffc;
                      auVar16._12_4_ = 0xbe7ffffc;
                      auVar89 = vfmadd213ps_avx512vl(auVar89,auVar81,auVar16);
                      auVar17._8_4_ = 0x3eaaaaaa;
                      auVar17._0_8_ = 0x3eaaaaaa3eaaaaaa;
                      auVar17._12_4_ = 0x3eaaaaaa;
                      auVar89 = vfmadd213ps_avx512vl(auVar89,auVar81,auVar17);
                      auVar69 = vmulps_avx512vl(auVar71,auVar81);
                      auVar69 = vmulps_avx512vl(auVar69,auVar89);
                      auVar18._8_4_ = 0xffffff82;
                      auVar18._0_8_ = 0xffffff82ffffff82;
                      auVar18._12_4_ = 0xffffff82;
                      auVar89 = vpaddd_avx512vl(auVar128,auVar18);
                      auVar89 = vcvtdq2ps_avx(auVar89);
                      auVar73 = vsubps_avx512vl(auVar89,auVar121);
                      bVar57 = (bool)((byte)uVar12 & 1);
                      auVar82._0_4_ = (uint)bVar57 * auVar73._0_4_ | (uint)!bVar57 * auVar89._0_4_;
                      bVar57 = (bool)((byte)(uVar12 >> 1) & 1);
                      auVar82._4_4_ = (uint)bVar57 * auVar73._4_4_ | (uint)!bVar57 * auVar89._4_4_;
                      bVar57 = (bool)((byte)(uVar12 >> 2) & 1);
                      auVar82._8_4_ = (uint)bVar57 * auVar73._8_4_ | (uint)!bVar57 * auVar89._8_4_;
                      bVar57 = (bool)((byte)(uVar12 >> 3) & 1);
                      auVar82._12_4_ =
                           (uint)bVar57 * auVar73._12_4_ | (uint)!bVar57 * auVar89._12_4_;
                      auVar89 = vfmadd231ps_avx512vl(auVar69,auVar82,auVar123);
                      auVar89 = vfmsub231ps_avx512vl(auVar89,auVar120,auVar71);
                      auVar89 = vsubps_avx512vl(auVar89,auVar81);
                      auVar89 = vfmsub231ps_fma(auVar89,auVar122,auVar82);
                      auVar128._8_4_ = 0xc0000000;
                      auVar128._0_8_ = 0xc0000000c0000000;
                      auVar128._12_4_ = 0xc0000000;
                      auVar89 = vmulps_avx512vl(auVar89,auVar128);
                      bVar57 = (bool)((byte)uVar55 & 1);
                      auVar83._0_4_ = (uint)bVar57 * 0x7fffffff | (uint)!bVar57 * auVar89._0_4_;
                      bVar57 = (bool)((byte)(uVar55 >> 1) & 1);
                      auVar83._4_4_ = (uint)bVar57 * 0x7fffffff | (uint)!bVar57 * auVar89._4_4_;
                      bVar57 = (bool)((byte)(uVar55 >> 2) & 1);
                      auVar83._8_4_ = (uint)bVar57 * 0x7fffffff | (uint)!bVar57 * auVar89._8_4_;
                      bVar57 = (bool)((byte)(uVar55 >> 3) & 1);
                      auVar83._12_4_ = (uint)bVar57 * 0x7fffffff | (uint)!bVar57 * auVar89._12_4_;
                      auVar89 = vminps_avx512vl(auVar83,auVar59);
                      auVar71 = vmaxps_avx512vl(auVar89,auVar60);
                      auVar89 = vfmadd213ps_fma(auVar119,auVar71,auVar120);
                      auVar69 = vcvttps2dq_avx512vl(auVar89);
                      auVar69 = vcvtdq2ps_avx512vl(auVar69);
                      uVar55 = vcmpps_avx512vl(auVar89,auVar69,1);
                      auVar89 = vsubps_avx512vl(auVar69,auVar121);
                      bVar57 = (bool)((byte)uVar55 & 1);
                      auVar84._0_4_ = (uint)bVar57 * auVar89._0_4_ | (uint)!bVar57 * auVar69._0_4_;
                      bVar57 = (bool)((byte)(uVar55 >> 1) & 1);
                      auVar84._4_4_ = (uint)bVar57 * auVar89._4_4_ | (uint)!bVar57 * auVar69._4_4_;
                      bVar57 = (bool)((byte)(uVar55 >> 2) & 1);
                      auVar84._8_4_ = (uint)bVar57 * auVar89._8_4_ | (uint)!bVar57 * auVar69._8_4_;
                      bVar57 = (bool)((byte)(uVar55 >> 3) & 1);
                      auVar84._12_4_ =
                           (uint)bVar57 * auVar89._12_4_ | (uint)!bVar57 * auVar69._12_4_;
                      auVar89 = vfmsub231ps_avx512vl(auVar71,auVar84,auVar122);
                      auVar89 = vfnmsub231ps_avx512vl(auVar89,auVar84,auVar123);
                      auVar129._0_4_ = auVar89._0_4_ * auVar89._0_4_;
                      auVar129._4_4_ = auVar89._4_4_ * auVar89._4_4_;
                      auVar129._8_4_ = auVar89._8_4_ * auVar89._8_4_;
                      auVar129._12_4_ = auVar89._12_4_ * auVar89._12_4_;
                      auVar71 = vfmadd213ps_avx512vl(auVar130,auVar89,auVar61);
                      auVar71 = vfmadd213ps_avx512vl(auVar71,auVar89,auVar131);
                      auVar71 = vfmadd213ps_avx512vl(auVar71,auVar89,auVar132);
                      auVar71 = vfmadd213ps_avx512vl(auVar71,auVar89,auVar62);
                      auVar71 = vfmadd213ps_avx512vl(auVar71,auVar89,auVar120);
                      auVar89 = vfmadd213ps_avx512vl(auVar71,auVar129,auVar89);
                      auVar89 = vaddps_avx512vl(auVar89,auVar121);
                      auVar71 = vcvttps2dq_avx512vl(auVar84);
                      auVar71 = vpslld_avx(auVar71,0x17);
                      auVar71 = vpaddd_avx512vl(auVar71,auVar63);
                      auVar71 = vfmadd213ps_fma(auVar71,auVar89,auVar121);
                      auVar89 = vrcpps_avx(auVar71);
                      auVar69 = vaddps_avx512vl(auVar89,auVar89);
                      auVar19._8_4_ = 0x40000000;
                      auVar19._0_8_ = 0x4000000040000000;
                      auVar19._12_4_ = 0x40000000;
                      auVar71 = vfmsub213ps_avx512vl(auVar71,auVar69,auVar19);
                      auVar89 = vfnmadd213ps_avx512vl(auVar71,auVar89,auVar69);
                      auVar85 = vfmsub231ps_fma(auVar85,auVar85,auVar70);
                      auVar88 = vfmsub231ps_fma(auVar88,auVar88,auVar89);
                      break;
                    case 6:
                      uVar5 = **(undefined4 **)(&this->field_0x118 + (long)p_Var39);
                      auVar69._4_4_ = uVar5;
                      auVar69._0_4_ = uVar5;
                      auVar69._8_4_ = uVar5;
                      auVar69._12_4_ = uVar5;
                      uVar5 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var39))[1];
                      auVar73._4_4_ = uVar5;
                      auVar73._0_4_ = uVar5;
                      auVar73._8_4_ = uVar5;
                      auVar73._12_4_ = uVar5;
                      auVar89 = vfmadd213ps_fma(auVar85,auVar69,auVar73);
                      auVar89 = vmaxps_avx(auVar89,(undefined1  [16])0x0);
                      auVar89 = vminps_avx(auVar89,auVar121);
                      auVar85._0_4_ = auVar89._0_4_ * auVar85._0_4_;
                      auVar85._4_4_ = auVar89._4_4_ * fVar46;
                      auVar85._8_4_ = auVar89._8_4_ * fVar2;
                      auVar85._12_4_ = auVar89._12_4_ * fVar94;
                      auVar89 = vfmadd213ps_fma(auVar69,auVar88,auVar73);
                      auVar89 = vmaxps_avx(auVar89,(undefined1  [16])0x0);
                      auVar89 = vminps_avx(auVar121,auVar89);
                      auVar88._0_4_ = auVar89._0_4_ * auVar88._0_4_;
                      auVar88._4_4_ = auVar89._4_4_ * fVar91;
                      auVar88._8_4_ = auVar89._8_4_ * fVar3;
                      auVar88._12_4_ = auVar89._12_4_ * fVar11;
                    }
                    if (iVar4 < 0x65) {
                      *pauVar52 = auVar85;
                      pauVar52[1] = auVar88;
                      pauVar52 = pauVar52 + 2;
                    }
                    else {
                      pfVar1 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var39) +
                                        local_2f0 * 0x20);
                      auVar97._0_4_ = auVar85._0_4_ * *pfVar1;
                      auVar97._4_4_ = auVar85._4_4_ * pfVar1[1];
                      auVar97._8_4_ = auVar85._8_4_ * pfVar1[2];
                      auVar97._12_4_ = auVar85._12_4_ * pfVar1[3];
                      pfVar1 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var39) + 0x10 +
                                        local_2f0 * 0x20);
                      auVar102._0_4_ = auVar88._0_4_ * *pfVar1;
                      auVar102._4_4_ = auVar88._4_4_ * pfVar1[1];
                      auVar102._8_4_ = auVar88._8_4_ * pfVar1[2];
                      auVar102._12_4_ = auVar88._12_4_ * pfVar1[3];
                      auVar88 = vpternlogd_avx512vl(auVar93,auVar97,auVar92,0xf8);
                      auVar89 = vpternlogd_avx512vl(auVar93,auVar102,auVar92,0xf8);
                      auVar98._0_4_ = (int)(auVar97._0_4_ + auVar88._0_4_);
                      auVar98._4_4_ = (int)(auVar97._4_4_ + auVar88._4_4_);
                      auVar98._8_4_ = (int)(auVar97._8_4_ + auVar88._8_4_);
                      auVar98._12_4_ = (int)(auVar97._12_4_ + auVar88._12_4_);
                      auVar103._0_4_ = (int)(auVar102._0_4_ + auVar89._0_4_);
                      auVar103._4_4_ = (int)(auVar102._4_4_ + auVar89._4_4_);
                      auVar103._8_4_ = (int)(auVar102._8_4_ + auVar89._8_4_);
                      auVar103._12_4_ = (int)(auVar102._12_4_ + auVar89._12_4_);
                      auVar88 = vpackssdw_avx(auVar98,auVar103);
                      auVar88 = vpminsw_avx512vl(auVar88,auVar90._0_16_);
                      auVar88 = vpmaxsw_avx512vl(auVar88,auVar58);
                      auVar88 = vpacksswb_avx(auVar88,auVar88);
                      *(long *)*pauVar49 = auVar88._0_8_;
                      pauVar49 = (undefined1 (*) [16])((long)*pauVar49 + 8);
                    }
                    bVar57 = iVar45 != iVar43;
                    iVar45 = iVar45 + 1;
                  } while (bVar57);
                }
                pp_Var34 = (_func_int **)(ulong)(iVar50 + 1);
              } while (iVar50 != (int)local_230);
            }
            local_2f0 = local_2f0 + 1;
            local_298 = (ulong)(uint)((int)local_298 + (int)uVar56 * 8);
          } while (local_2f0 != local_280);
        }
        iVar41 = 0;
        local_288 = top_blob;
        if ((pointer)local_2e8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ - local_2e8._0_8_);
        }
      }
      goto LAB_003ef491;
    }
    pp_Var37 = this->_vptr_ConvolutionDepthWise_x86_avx512;
    p_Var39 = pp_Var37[-3];
    iVar50 = *(int *)(&this->field_0xd8 + (long)p_Var39);
    if (iVar50 == 3 && *(int *)(&this->field_0xd4 + (long)p_Var39) == 3) {
      if ((((*(int *)(&this->field_0xe4 + (long)p_Var39) == 1) &&
           (*(int *)(&this->field_0xe8 + (long)p_Var39) == 1)) &&
          (*(int *)(&this->field_0xdc + (long)p_Var39) == 1)) &&
         ((*(int *)(&this->field_0xe0 + (long)p_Var39) == 1 &&
          (*(uint *)(&this->field_0x110 + (long)p_Var39) < 2)))) {
        if (iVar4 < 0x65) {
          local_2e8 = ZEXT1624((undefined1  [16])0x0);
          p_Var39 = pp_Var37[-3];
          if (0 < *(int *)(&this->field_0x108 + (long)p_Var39)) {
            lVar42 = 0;
            do {
              fVar46 = 1.0 / (*(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var39) + lVar42 * 4)
                             * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var39) + lVar42 * 4
                                         ));
              local_278._0_4_ = fVar46;
              if (local_2e8._8_8_ == local_2e8._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_2e8,
                           (iterator)local_2e8._8_8_,(float *)local_278);
              }
              else {
                *(float *)local_2e8._8_8_ = fVar46;
                local_2e8._8_8_ = (float *)(local_2e8._8_8_ + 4);
              }
              lVar42 = lVar42 + 1;
              p_Var39 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
            } while (lVar42 < *(int *)(&this->field_0x108 + (long)p_Var39));
          }
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_a8,(vector<float,_std::allocator<float>_> *)local_2e8);
          convdw3x3s1_int8_dequant_sse
                    (&local_228,top_blob,(Mat *)(this->weight_data_tm).data,
                     *(Mat **)(&this->field_0x1b0 + (long)p_Var39),&local_a8,opt_00);
          local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
          local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage =
               local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
        }
        else {
          local_2e8 = ZEXT1624((undefined1  [16])0x0);
          p_Var39 = pp_Var37[-3];
          if (0 < *(int *)(&this->field_0x108 + (long)p_Var39)) {
            lVar42 = 0;
            do {
              fVar46 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var39) + lVar42 * 4);
              fVar91 = 0.0;
              if (fVar46 != 0.0) {
                fVar91 = 1.0 / (fVar46 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var39) +
                                                   lVar42 * 4));
              }
              local_278._0_4_ = fVar91;
              local_1c8 = (pointer)CONCAT44(local_1c8._4_4_,
                                            *(undefined4 *)
                                             (*(long *)(&this->field_0x288 + (long)p_Var39) +
                                             lVar42 * 4));
              pAVar38 = (Allocator *)local_2e8._16_8_;
              if (local_2e8._8_8_ == local_2e8._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_2e8,
                           (iterator)local_2e8._8_8_,(float *)local_278);
                pAVar38 = (Allocator *)local_2e8._16_8_;
                iVar47._M_current = (float *)local_2e8._8_8_;
              }
              else {
                *(float *)local_2e8._8_8_ = fVar91;
                iVar47._M_current = (float *)(local_2e8._8_8_ + 4);
                local_2e8._8_8_ = iVar47._M_current;
              }
              if ((Allocator *)iVar47._M_current == pAVar38) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_2e8,iVar47,
                           (float *)&local_1c8);
              }
              else {
                *iVar47._M_current = local_1c8._0_4_;
                local_2e8._8_8_ = iVar47._M_current + 1;
              }
              lVar42 = lVar42 + 1;
              p_Var39 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
            } while (lVar42 < *(int *)(&this->field_0x108 + (long)p_Var39));
          }
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_90,(vector<float,_std::allocator<float>_> *)local_2e8);
          convdw3x3s1_int8_requant_sse
                    (&local_228,top_blob,(Mat *)(this->weight_data_tm).data,
                     *(Mat **)(&this->field_0x1b0 + (long)p_Var39),&local_90,opt_00);
          local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
          local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage =
               local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
        }
      }
      else {
        iVar50 = 3;
        if ((((*(int *)(&this->field_0xdc + (long)p_Var39) != 1) ||
             ((*(int *)(&this->field_0xe0 + (long)p_Var39) != 1 ||
              (*(int *)(&this->field_0xe4 + (long)p_Var39) != 2)))) ||
            (*(int *)(&this->field_0xe8 + (long)p_Var39) != 2)) ||
           (1 < *(uint *)(&this->field_0x110 + (long)p_Var39))) goto LAB_003eeefb;
        if (iVar4 < 0x65) {
          local_2e8 = ZEXT1624((undefined1  [16])0x0);
          p_Var39 = pp_Var37[-3];
          if (0 < *(int *)(&this->field_0x108 + (long)p_Var39)) {
            lVar42 = 0;
            do {
              fVar46 = 1.0 / (*(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var39) + lVar42 * 4)
                             * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var39) + lVar42 * 4
                                         ));
              local_278._0_4_ = fVar46;
              if (local_2e8._8_8_ == local_2e8._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_2e8,
                           (iterator)local_2e8._8_8_,(float *)local_278);
              }
              else {
                *(float *)local_2e8._8_8_ = fVar46;
                local_2e8._8_8_ = (float *)(local_2e8._8_8_ + 4);
              }
              lVar42 = lVar42 + 1;
              p_Var39 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
            } while (lVar42 < *(int *)(&this->field_0x108 + (long)p_Var39));
          }
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_d8,(vector<float,_std::allocator<float>_> *)local_2e8);
          convdw3x3s2_int8_dequant_sse
                    (&local_228,top_blob,(Mat *)(this->weight_data_tm).data,
                     *(Mat **)(&this->field_0x1b0 + (long)p_Var39),&local_d8,opt_00);
        }
        else {
          local_2e8 = ZEXT1624((undefined1  [16])0x0);
          p_Var39 = pp_Var37[-3];
          if (0 < *(int *)(&this->field_0x108 + (long)p_Var39)) {
            lVar42 = 0;
            do {
              fVar46 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var39) + lVar42 * 4);
              fVar91 = 0.0;
              if (fVar46 != 0.0) {
                fVar91 = 1.0 / (fVar46 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var39) +
                                                   lVar42 * 4));
              }
              local_278._0_4_ = fVar91;
              local_1c8 = (pointer)CONCAT44(local_1c8._4_4_,
                                            *(undefined4 *)
                                             (*(long *)(&this->field_0x288 + (long)p_Var39) +
                                             lVar42 * 4));
              pAVar38 = (Allocator *)local_2e8._16_8_;
              if (local_2e8._8_8_ == local_2e8._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_2e8,
                           (iterator)local_2e8._8_8_,(float *)local_278);
                pAVar38 = (Allocator *)local_2e8._16_8_;
                iVar47._M_current = (float *)local_2e8._8_8_;
              }
              else {
                *(float *)local_2e8._8_8_ = fVar91;
                iVar47._M_current = (float *)(local_2e8._8_8_ + 4);
                local_2e8._8_8_ = iVar47._M_current;
              }
              if ((Allocator *)iVar47._M_current == pAVar38) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_2e8,iVar47,
                           (float *)&local_1c8);
              }
              else {
                *iVar47._M_current = local_1c8._0_4_;
                local_2e8._8_8_ = iVar47._M_current + 1;
              }
              lVar42 = lVar42 + 1;
              p_Var39 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
            } while (lVar42 < *(int *)(&this->field_0x108 + (long)p_Var39));
          }
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_c0,(vector<float,_std::allocator<float>_> *)local_2e8);
          convdw3x3s2_int8_requant_sse
                    (&local_228,top_blob,(Mat *)(this->weight_data_tm).data,
                     *(Mat **)(&this->field_0x1b0 + (long)p_Var39),&local_c0,opt_00);
          local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
          local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage =
               local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
        }
      }
      if (local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((pointer)local_2e8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ - local_2e8._0_8_);
      }
      iVar41 = 0;
      pLVar10 = this->activation;
      if (pLVar10 != (Layer *)0x0) {
        (*pLVar10->_vptr_Layer[9])(pLVar10,top_blob,opt);
      }
    }
    else {
LAB_003eeefb:
      uVar44 = iVar50 * *(int *)(&this->field_0xd4 + (long)p_Var39);
      local_178 = (size_type)(int)uVar44;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_2e8,local_178,
                 (allocator_type *)local_278);
      uVar29 = local_2e8._0_8_;
      pp_Var37 = this->_vptr_ConvolutionDepthWise_x86_avx512;
      p_Var39 = pp_Var37[-3];
      if (0 < *(int *)(&this->field_0xd8 + (long)p_Var39)) {
        iVar50 = *(int *)(&this->field_0xe0 + (long)p_Var39);
        iVar45 = *(int *)(&this->field_0xdc + (long)p_Var39);
        iVar6 = *(int *)(&this->field_0xd4 + (long)p_Var39);
        iVar41 = 0;
        fVar46 = 0.0;
        iVar48 = 0;
        do {
          if (0 < *(int *)(&this->field_0xd4 + (long)p_Var39)) {
            lVar42 = 0;
            do {
              *(float *)(local_2e8._0_8_ + (iVar48 + lVar42) * 4) = fVar46;
              p_Var39 = pp_Var37[-3];
              fVar46 = (float)((int)fVar46 + *(int *)(&this->field_0xdc + (long)p_Var39));
              lVar42 = lVar42 + 1;
            } while ((int)lVar42 < *(int *)(&this->field_0xd4 + (long)p_Var39));
            iVar48 = iVar48 + (int)lVar42;
          }
          fVar46 = (float)((int)fVar46 + (iVar33 * iVar50 - iVar45 * iVar6));
          iVar41 = iVar41 + 1;
        } while (iVar41 < *(int *)(&this->field_0xd8 + (long)p_Var39));
      }
      if (0 < *(int *)(&this->field_0x108 + (long)p_Var39)) {
        lVar42 = 0;
        auVar90 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
        lVar54 = 0;
        local_288 = top_blob;
        local_180 = pp_Var37;
        do {
          pvVar8 = local_228.data;
          if (-1 < (int)local_230) {
            lVar51 = local_228.cstep * lVar54 * local_228.elemsize;
            local_310 = (float *)(local_288->elemsize * lVar54 * local_288->cstep +
                                 (long)local_288->data);
            local_290 = this->_vptr_ConvolutionDepthWise_x86_avx512;
            lVar53 = (long)local_228.w * local_228.elemsize;
            pvVar9 = (this->weight_data_tm).data;
            local_1d8 = 0;
            local_300 = local_310;
            local_280 = lVar53;
            local_170 = lVar42;
            do {
              if (-1 < iVar43) {
                local_298 = (ulong)(int)local_1d8;
                iVar50 = 0;
                do {
                  p_Var39 = local_290[-3];
                  fVar46 = 0.0;
                  fVar91 = 0.0;
                  if (0 < (int)uVar44) {
                    uVar56 = 0;
                    iVar45 = 0;
                    do {
                      iVar45 = iVar45 + (int)*(char *)((long)pvVar9 + uVar56 + lVar42) *
                                        (int)*(char *)((long)pvVar8 +
                                                      (long)(int)*(pointer)(uVar29 + uVar56 * 4) +
                                                      (long)*(int *)(&this->field_0xe8 +
                                                                    (long)p_Var39) * local_298 *
                                                      lVar53 + (long)iVar50 *
                                                               (long)*(int *)(&this->field_0xe4 +
                                                                             (long)p_Var39) + lVar51
                                                      );
                      uVar56 = uVar56 + 1;
                    } while (uVar44 != uVar56);
                    fVar91 = (float)iVar45;
                  }
                  fVar2 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var39) + lVar54 * 4);
                  if (fVar2 != 0.0) {
                    fVar46 = 1.0 / (fVar2 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var39)
                                                      + lVar54 * 4));
                  }
                  fVar46 = fVar46 * fVar91;
                  if (*(int *)(&this->field_0x100 + (long)p_Var39) != 0) {
                    fVar46 = fVar46 + *(float *)(*(long *)(&this->field_0x1b0 + (long)p_Var39) +
                                                lVar54 * 4);
                  }
                  auVar58 = ZEXT416((uint)fVar46);
                  fVar91 = fVar46;
                  switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var39)) {
                  case 1:
                    auVar58 = vmaxss_avx(auVar58,ZEXT416(0));
                    fVar91 = auVar58._0_4_;
                    break;
                  case 2:
                    uVar13 = vcmpss_avx512f(auVar58,ZEXT416(0),0xe);
                    bVar57 = (bool)((byte)uVar13 & 1);
                    fVar91 = (float)((uint)bVar57 * 0x3f800000 +
                                    (uint)!bVar57 * **(int **)(&this->field_0x118 + (long)p_Var39))
                             * fVar46;
                    break;
                  case 3:
                    fVar46 = (float)(*(uint **)(&this->field_0x118 + (long)p_Var39))[1];
                    auVar58 = vmaxss_avx(auVar58,ZEXT416(**(uint **)(&this->field_0x118 +
                                                                    (long)p_Var39)));
                    fVar91 = auVar58._0_4_;
                    if (fVar46 < auVar58._0_4_) {
                      fVar91 = fVar46;
                    }
                    break;
                  case 4:
                    auVar58 = vminss_avx(auVar58,SUB6416(ZEXT464(0x42b0c0a5),0));
                    uVar13 = vcmpss_avx512f(auVar58,ZEXT416(0xc2b0c0a5),1);
                    bVar57 = (bool)((byte)uVar13 & 1);
                    fVar46 = expf((float)((uint)bVar57 * 0x42b0c0a5 +
                                         (uint)!bVar57 * (auVar58._0_4_ ^ auVar90._0_4_)));
                    auVar90 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000))
                                      );
                    lVar53 = local_280;
                    fVar91 = 1.0 / (fVar46 + 1.0);
                    break;
                  case 5:
                    local_1cc = fVar46;
                    fVar46 = expf(fVar46);
                    fVar46 = logf(fVar46 + 1.0);
                    fVar46 = tanhf(fVar46);
                    auVar90 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000))
                                      );
                    lVar53 = local_280;
                    fVar91 = fVar46 * local_1cc;
                    break;
                  case 6:
                    fVar2 = **(float **)(&this->field_0x118 + (long)p_Var39);
                    fVar3 = (*(float **)(&this->field_0x118 + (long)p_Var39))[1];
                    fVar94 = (float)((uint)fVar3 ^ auVar90._0_4_) / fVar2;
                    fVar91 = 0.0;
                    if ((fVar94 <= fVar46) && (fVar91 = fVar46, fVar46 <= fVar94 + 1.0 / fVar2)) {
                      auVar58 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar58,ZEXT416((uint)fVar3));
                      fVar91 = auVar58._0_4_ * fVar46;
                    }
                  }
                  if (iVar4 < 0x65) {
                    *local_310 = fVar91;
                    local_310 = local_310 + 1;
                  }
                  else {
                    fVar91 = fVar91 * *(float *)(*(long *)(&this->field_0x288 + (long)p_Var39) +
                                                lVar54 * 4);
                    auVar58._8_4_ = 0x3effffff;
                    auVar58._0_8_ = 0x3effffff3effffff;
                    auVar58._12_4_ = 0x3effffff;
                    auVar58 = vpternlogd_avx512vl(auVar58,ZEXT416((uint)fVar91),auVar90._0_16_,0xf8)
                    ;
                    auVar58 = ZEXT416((uint)(fVar91 + auVar58._0_4_));
                    auVar58 = vroundss_avx(auVar58,auVar58,0xb);
                    iVar45 = (int)auVar58._0_4_;
                    if (iVar45 < -0x7e) {
                      iVar45 = -0x7f;
                    }
                    uVar35 = (undefined1)iVar45;
                    if (0x7e < iVar45) {
                      uVar35 = 0x7f;
                    }
                    *(undefined1 *)local_300 = uVar35;
                    local_300 = (float *)((long)local_300 + 1);
                  }
                  bVar57 = iVar50 != iVar43;
                  iVar50 = iVar50 + 1;
                } while (bVar57);
              }
              iVar50 = (int)local_1d8;
              local_1d8 = (ulong)(iVar50 + 1);
            } while (iVar50 != (int)local_230);
            p_Var39 = local_180[-3];
            lVar42 = local_170;
          }
          lVar54 = lVar54 + 1;
          lVar42 = lVar42 + local_178;
        } while (lVar54 < *(int *)(&this->field_0x108 + (long)p_Var39));
      }
      if ((pointer)local_2e8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ - local_2e8._0_8_);
      }
      iVar41 = 0;
    }
    goto LAB_003ef491;
  }
  uVar36 = *(uint *)(&this->field_0xd0 + (long)p_Var39);
  iVar43 = *(int *)(&this->field_0x10c + (long)p_Var39);
  local_298 = 1;
  if (opt->use_packing_layout == true) {
    if (iVar43 < 0x65) {
      local_298 = (ulong)((uint)((uVar36 & 3) == 0) * 3 + 1);
    }
    else {
      local_298 = 1;
      if ((uVar36 & 7) == 0) {
        local_298 = 8;
      }
    }
  }
  iVar4 = (int)local_298;
  uVar56 = (ulong)(uint)(iVar4 * 4);
  if (100 < iVar43) {
    uVar56 = local_298;
  }
  local_290 = (_func_int **)CONCAT44(local_290._4_4_,iVar45);
  Mat::create(top_blob,iVar45,iVar50,(int)uVar36 / iVar4,uVar56,iVar4,opt->blob_allocator);
  OVar30 = _local_2e8;
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_003ef491;
  uVar44 = (int)uVar44 /
           *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]);
  uVar36 = *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]) /
           *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]);
  iVar45 = 1;
  _elempack = 1;
  if (opt->use_packing_layout == true) {
    iVar45 = 1;
    if ((uVar44 & 7) == 0) {
      iVar45 = 8;
    }
    if (iVar43 < 0x65) {
      _elempack = (uint)((uVar36 & 3) == 0) * 3 + 1;
    }
    else {
      _elempack = 1;
      if ((uVar36 & 7) == 0) {
        _elempack = 8;
      }
    }
  }
  piVar7 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
  local_2e8._12_4_ = local_228.refcount._4_4_;
  local_2e8._8_4_ = local_228.refcount._0_4_;
  local_2e8._0_8_ = local_228.data;
  local_2e8._16_8_ = local_228.elemsize;
  auStack_2cc = OVar30._28_36_;
  iStack_2d0 = local_228.elempack;
  pAStack_2c8 = local_228.allocator;
  uStack_2c0._4_1_ = (bool)(undefined1)local_228.w;
  uStack_2c0._5_1_ = (bool)local_228.w._1_1_;
  uStack_2c0._6_1_ = (bool)local_228.w._2_1_;
  uStack_2c0._7_1_ = (bool)local_228.w._3_1_;
  uStack_2c0._0_1_ = (bool)(undefined1)local_228.dims;
  uStack_2c0._1_1_ = (bool)local_228.dims._1_1_;
  uStack_2c0._2_1_ = (bool)local_228.dims._2_1_;
  uStack_2c0._3_1_ = (bool)local_228.dims._3_1_;
  uStack_2b8._4_1_ = (bool)(undefined1)local_228.d;
  uStack_2b8._5_1_ = (bool)local_228.d._1_1_;
  uStack_2b8._6_1_ = (bool)local_228.d._2_1_;
  uStack_2b8._7_1_ = (bool)local_228.d._3_1_;
  uStack_2b8._0_4_ = local_228.h;
  auStack_2cc._32_4_ = OVar30._60_4_;
  iStack_2b0._0_1_ = (bool)(undefined1)local_228.c;
  iStack_2b0._1_1_ = (bool)local_228.c._1_1_;
  iStack_2b0._2_1_ = (bool)local_228.c._2_1_;
  iStack_2b0._3_1_ = (bool)local_228.c._3_1_;
  local_2a8 = local_228.cstep;
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + 1;
    UNLOCK();
  }
  if (iVar45 < iVar6) {
    auVar90 = vmovdqu64_avx512f((undefined1  [64])*opt);
    auVar90 = vmovdqu64_avx512f(auVar90);
    stack0xfffffffffffffd98 = auVar90._16_48_;
    local_278._0_8_ = auVar90._0_8_;
    local_278._8_8_ = opt->workspace_allocator;
    convert_packing(&local_228,(Mat *)local_2e8,iVar45,(Option *)local_278);
  }
  auVar32 = stack0xfffffffffffffd98;
  piVar7 = top_blob->refcount;
  uVar24 = top_blob->data;
  uVar25 = top_blob->refcount;
  uVar26 = top_blob->elemsize;
  uVar27 = top_blob->elempack;
  iStack_260 = uVar27;
  local_278._16_8_ = uVar26;
  local_278._8_8_ = uVar25;
  local_278._0_8_ = uVar24;
  auStack_25c = auVar32._12_36_;
  pAStack_258 = top_blob->allocator;
  uVar20 = top_blob->dims;
  uVar21 = top_blob->w;
  uStack_250._4_4_ = uVar21;
  uStack_250._0_4_ = uVar20;
  uVar22 = top_blob->h;
  uVar23 = top_blob->d;
  uStack_248._4_4_ = uVar23;
  uStack_248._0_4_ = uVar22;
  auStack_25c._32_4_ = auVar32._44_4_;
  iStack_240 = top_blob->c;
  local_238 = top_blob->cstep;
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + 1;
    UNLOCK();
  }
  pp_Var37 = this->_vptr_ConvolutionDepthWise_x86_avx512;
  if (_elempack < (uint)local_298) {
    Mat::create((Mat *)local_278,(int)local_290,iVar50,
                *(int *)(&this->field_0xd0 + (long)pp_Var37[-3]) / (int)_elempack,
                (ulong)((byte)((ushort)uVar56 / (ushort)(byte)local_298) * _elempack),_elempack,
                opt->workspace_allocator);
    iVar41 = -100;
    bVar57 = (void *)local_278._0_8_ != (void *)0x0;
    if ((bVar57) && (lVar42 = (long)iStack_240, lVar42 * local_238 != 0)) {
      pp_Var37 = this->_vptr_ConvolutionDepthWise_x86_avx512;
      goto LAB_003ee855;
    }
  }
  else {
LAB_003ee855:
    local_288 = top_blob;
    if (0 < *(int *)(&this->field_0x108 + (long)pp_Var37[-3])) {
      local_290 = (_func_int **)CONCAT44(local_290._4_4_,(int)uVar44 / iVar45);
      iVar50 = 0;
      iVar43 = 0;
      lVar42 = 0;
      do {
        OVar31 = _local_278;
        OVar30 = _local_2e8;
        local_1c8 = (pointer)((long)(iVar50 / iVar45) * local_2a8 * local_2e8._16_8_ +
                             local_2e8._0_8_);
        local_1c0 = (int *)0x0;
        local_1b8 = (Allocator *)local_2e8._16_8_;
        local_1b0 = iStack_2d0;
        local_1a8 = pAStack_2c8;
        local_190 = (int)local_290;
        uVar29 = uStack_2c0;
        uVar13 = uStack_2b8;
        local_188 = ((long)uStack_2b8._4_4_ * local_2e8._16_8_ *
                     (long)(int)uStack_2b8 * (long)uStack_2c0._4_4_ + 0xfU & 0xfffffffffffffff0) /
                    (ulong)local_2e8._16_8_;
        uStack_2c0._0_4_ = (int)uVar29;
        uStack_2c0._4_4_ = SUB84(uVar29,4);
        local_1a0 = (int)uStack_2c0;
        iStack_19c = uStack_2c0._4_4_;
        uStack_2b8._0_4_ = (int)uVar13;
        uStack_2b8._4_4_ = SUB84(uVar13,4);
        iStack_198 = (int)uStack_2b8;
        iStack_194 = uStack_2b8._4_4_;
        local_120 = (void *)((long)(iVar43 / (int)_elempack) * local_238 * local_278._16_8_ +
                            local_278._0_8_);
        local_118 = (int *)0x0;
        local_110 = (Allocator *)local_278._16_8_;
        local_108 = iStack_260;
        local_100 = pAStack_258;
        uVar29 = uStack_250;
        uVar13 = uStack_248;
        local_e0 = ((long)uStack_248._4_4_ * local_278._16_8_ *
                    (long)(int)uStack_248 * (long)uStack_250._4_4_ + 0xfU & 0xfffffffffffffff0) /
                   (ulong)local_278._16_8_;
        uStack_250._0_4_ = (int)uVar29;
        uStack_250._4_4_ = SUB84(uVar29,4);
        local_f8 = (int)uStack_250;
        iStack_f4 = uStack_250._4_4_;
        uStack_248._0_4_ = (int)uVar13;
        uStack_248._4_4_ = SUB84(uVar13,4);
        iStack_f0 = (int)uStack_248;
        iStack_ec = uStack_248._4_4_;
        pLVar10 = (this->group_ops).
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar42];
        auVar90 = vmovdqu64_avx512f((undefined1  [64])*opt);
        auVar90 = vmovdqu64_avx512f(auVar90);
        auStack_68 = auVar90._16_48_;
        local_78._0_8_ = auVar90._0_8_;
        local_78._8_8_ = pAStack_258;
        _local_2e8 = OVar30;
        _local_278 = OVar31;
        local_e8 = (int)uVar36 / (int)_elempack;
        (*pLVar10->_vptr_Layer[7])(pLVar10,&local_1c8,&local_120,local_78);
        if (local_118 != (int *)0x0) {
          LOCK();
          *local_118 = *local_118 + -1;
          UNLOCK();
          if (*local_118 == 0) {
            if (local_100 == (Allocator *)0x0) {
              if (local_120 != (void *)0x0) {
                free(local_120);
              }
            }
            else {
              (*local_100->_vptr_Allocator[3])();
            }
          }
        }
        if (local_1c0 != (int *)0x0) {
          LOCK();
          *local_1c0 = *local_1c0 + -1;
          UNLOCK();
          if (*local_1c0 == 0) {
            if (local_1a8 == (Allocator *)0x0) {
              if (local_1c8 != (pointer)0x0) {
                free(local_1c8);
              }
            }
            else {
              (*local_1a8->_vptr_Allocator[3])();
            }
          }
        }
        lVar42 = lVar42 + 1;
        iVar43 = iVar43 + uVar36;
        iVar50 = iVar50 + uVar44;
      } while (lVar42 < *(int *)(&this->field_0x108 +
                                (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]));
    }
    pMVar28 = local_288;
    iVar41 = 0;
    if (_elempack < (uint)local_298) {
      convert_packing((Mat *)local_278,local_288,(uint)local_298,opt);
    }
    else if ((Mat *)local_278 != local_288) {
      if ((Allocator *)local_278._8_8_ != (Allocator *)0x0) {
        LOCK();
        *(int *)(_func_int ***)local_278._8_8_ = *(int *)(_func_int ***)local_278._8_8_ + 1;
        UNLOCK();
      }
      piVar7 = local_288->refcount;
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          if (local_288->allocator == (Allocator *)0x0) {
            if (local_288->data != (void *)0x0) {
              free(local_288->data);
            }
          }
          else {
            (*local_288->allocator->_vptr_Allocator[3])();
          }
        }
      }
      OVar30 = _local_278;
      pMVar28->data = (void *)local_278._0_8_;
      pMVar28->refcount = (int *)local_278._8_8_;
      pMVar28->elemsize = local_278._16_8_;
      pMVar28->elempack = iStack_260;
      pMVar28->allocator = pAStack_258;
      pMVar28->dims = (int)uStack_250;
      pMVar28->w = uStack_250._4_4_;
      pMVar28->h = (int)uStack_248;
      pMVar28->d = uStack_248._4_4_;
      iStack_240 = OVar30._56_4_;
      pMVar28->c = iStack_240;
      pMVar28->cstep = local_238;
      _local_278 = OVar30;
    }
  }
  if ((Allocator *)local_278._8_8_ != (Allocator *)0x0) {
    LOCK();
    *(int *)(_func_int ***)local_278._8_8_ = *(int *)(_func_int ***)local_278._8_8_ + -1;
    UNLOCK();
    if (*(int *)(_func_int ***)local_278._8_8_ == 0) {
      if (pAStack_258 == (Allocator *)0x0) {
        if ((void *)local_278._0_8_ != (void *)0x0) {
          free((void *)local_278._0_8_);
        }
      }
      else {
        (*pAStack_258->_vptr_Allocator[3])();
      }
    }
  }
  if ((Allocator *)local_2e8._8_8_ != (Allocator *)0x0) {
    LOCK();
    *(int *)(_func_int ***)local_2e8._8_8_ = *(int *)(_func_int ***)local_2e8._8_8_ + -1;
    UNLOCK();
    if (*(int *)(_func_int ***)local_2e8._8_8_ == 0) {
      if (pAStack_2c8 == (Allocator *)0x0) {
        if ((pointer)local_2e8._0_8_ != (pointer)0x0) {
          free((void *)local_2e8._0_8_);
        }
      }
      else {
        (*pAStack_2c8->_vptr_Allocator[3])();
      }
    }
  }
LAB_003ef491:
  piVar7 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_228.allocator == (Allocator *)0x0) {
        if (local_228.data != (void *)0x0) {
          free(local_228.data);
        }
      }
      else {
        (*(local_228.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_168.refcount != (int *)0x0) {
    LOCK();
    *local_168.refcount = *local_168.refcount + -1;
    UNLOCK();
    if (*local_168.refcount == 0) {
      if (local_168.allocator == (Allocator *)0x0) {
        if (local_168.data != (void *)0x0) {
          free(local_168.data);
        }
      }
      else {
        (*(local_168.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar41;
}

Assistant:

int ConvolutionDepthWise_x86_avx512::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;

    int elembits = bottom_blob.elembits();

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        const int channels_g = channels * elempack / group;

        Mat scales(channels * elempack);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    channels = bottom_blob_bordered.c;
    elempack = bottom_blob_bordered.elempack;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__
        bool use_int8_requantize = int8_scale_term > 100;
        size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

        top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
        if (elempack == 8)
        {
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128i _sum0 = _mm_setzero_si128();
                            __m128i _sum1 = _mm_setzero_si128();

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                // TODO use _mm_cvtepi8_epi16 on sse4.1
                                __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                                __m128i _w = _mm_loadl_epi64((const __m128i*)(kptr + k * 8));
                                _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                                __m128i _sl = _mm_mullo_epi16(_val, _w);
                                __m128i _sh = _mm_mulhi_epi16(_val, _w);
                                __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                                __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                                _sum0 = _mm_add_epi32(_sum0, _s0);
                                _sum1 = _mm_add_epi32(_sum1, _s1);
                            }

                            __m128 _scale_in0;
                            __m128 _scale_in1;
                            {
                                __m128 _bottom_blob_int8_scales0 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8);
                                __m128 _bottom_blob_int8_scales1 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8 + 4);
                                __m128 _weight_data_int8_scales0 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8);
                                __m128 _weight_data_int8_scales1 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8 + 4);
                                _scale_in0 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales0, _weight_data_int8_scales0));
                                _scale_in1 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales1, _weight_data_int8_scales1));

                                __m128 _m0 = _mm_cmpneq_ps(_weight_data_int8_scales0, _mm_setzero_ps());
                                __m128 _m1 = _mm_cmpneq_ps(_weight_data_int8_scales1, _mm_setzero_ps());
                                _scale_in0 = _mm_and_ps(_scale_in0, _m0);
                                _scale_in1 = _mm_and_ps(_scale_in1, _m1);
                            }

                            __m128 _sumfp32_0 = _mm_mul_ps(_mm_cvtepi32_ps(_sum0), _scale_in0);
                            __m128 _sumfp32_1 = _mm_mul_ps(_mm_cvtepi32_ps(_sum1), _scale_in1);

                            if (bias_term)
                            {
                                __m128 _bias0 = _mm_loadu_ps((const float*)bias_data + g * 8);
                                __m128 _bias1 = _mm_loadu_ps((const float*)bias_data + g * 8 + 4);
                                _sumfp32_0 = _mm_add_ps(_sumfp32_0, _bias0);
                                _sumfp32_1 = _mm_add_ps(_sumfp32_1, _bias1);
                            }

                            _sumfp32_0 = activation_sse(_sumfp32_0, activation_type, activation_params);
                            _sumfp32_1 = activation_sse(_sumfp32_1, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize and relu
                                __m128 _scale_out0 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8);
                                __m128 _scale_out1 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8 + 4);
                                _sumfp32_0 = _mm_mul_ps(_sumfp32_0, _scale_out0);
                                _sumfp32_1 = _mm_mul_ps(_sumfp32_1, _scale_out1);
                                int64_t _sum8 = float2int8_sse(_sumfp32_0, _sumfp32_1);

                                *(int64_t*)outptr_s8 = _sum8;
                                outptr_s8 += 8;
                            }
                            else
                            {
                                // dequantize and relu
                                _mm_storeu_ps(outptr_f32, _sumfp32_0);
                                _mm_storeu_ps(outptr_f32 + 4, _sumfp32_1);
                                outptr_f32 += 8;
                            }
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 1 && stride_h == 1 && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < group; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int sum = 0;

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g];

                            sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize
                                float scale_out = top_blob_int8_scales[g];
                                signed char sums8 = float2int8(sumfp32 * scale_out);
                                outptr_s8[0] = sums8;
                                outptr_s8 += 1;
                            }
                            else
                            {
                                // dequantize
                                outptr_f32[0] = sumfp32;
                                outptr_f32 += 1;
                            }
                        }
                    }
                }
            }
        }

        return 0;
    }

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        g_elempack = channels_g % 8 == 0 ? 8 : 1;
        if (use_int8_requantize)
            out_g_elempack = num_output_g % 8 == 0 ? 8 : 1;
        else
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}